

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_183::InfoCollector::visitUnary(InfoCollector *this,Unary *curr)

{
  PossibleContents local_38;
  Unary *local_18;
  Unary *curr_local;
  InfoCollector *this_local;
  
  local_18 = curr;
  curr_local = (Unary *)this;
  PossibleContents::many();
  addRoot(this,(Expression *)curr,&local_38);
  PossibleContents::~PossibleContents(&local_38);
  return;
}

Assistant:

void visitUnary(Unary* curr) {
    // We could optimize cases like this using interpreter integration: if the
    // input is a Literal, we could interpret the Literal result. However, if
    // the input is a literal then the GUFA pass will emit a Const there, and
    // the Precompute pass can use that later to interpret a result. That is,
    // the input we need here, a constant, is already something GUFA can emit as
    // an output. As a result, integrating the interpreter here would perhaps
    // make compilation require fewer steps, but it wouldn't let us optimize
    // more than we could before.
    addRoot(curr);
  }